

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_v128.h
# Opt level: O2

v256 * v256_min_s8(v256 a,v256 b)

{
  v256 *in_RDI;
  
  *(char *)in_RDI->val[1] =
       ((char)b.val[1][0] < (char)a.val[1][0]) * (char)b.val[1][0] |
       ((char)b.val[1][0] >= (char)a.val[1][0]) * (char)a.val[1][0];
  *(char *)((long)in_RDI->val[1] + 1) =
       (b.val[1][0]._1_1_ < a.val[1][0]._1_1_) * b.val[1][0]._1_1_ |
       (b.val[1][0]._1_1_ >= a.val[1][0]._1_1_) * a.val[1][0]._1_1_;
  *(char *)((long)in_RDI->val[1] + 2) =
       (b.val[1][0]._2_1_ < a.val[1][0]._2_1_) * b.val[1][0]._2_1_ |
       (b.val[1][0]._2_1_ >= a.val[1][0]._2_1_) * a.val[1][0]._2_1_;
  *(char *)((long)in_RDI->val[1] + 3) =
       (b.val[1][0]._3_1_ < a.val[1][0]._3_1_) * b.val[1][0]._3_1_ |
       (b.val[1][0]._3_1_ >= a.val[1][0]._3_1_) * a.val[1][0]._3_1_;
  *(char *)((long)in_RDI->val[1] + 4) =
       (b.val[1][0]._4_1_ < a.val[1][0]._4_1_) * b.val[1][0]._4_1_ |
       (b.val[1][0]._4_1_ >= a.val[1][0]._4_1_) * a.val[1][0]._4_1_;
  *(char *)((long)in_RDI->val[1] + 5) =
       (b.val[1][0]._5_1_ < a.val[1][0]._5_1_) * b.val[1][0]._5_1_ |
       (b.val[1][0]._5_1_ >= a.val[1][0]._5_1_) * a.val[1][0]._5_1_;
  *(char *)((long)in_RDI->val[1] + 6) =
       (b.val[1][0]._6_1_ < a.val[1][0]._6_1_) * b.val[1][0]._6_1_ |
       (b.val[1][0]._6_1_ >= a.val[1][0]._6_1_) * a.val[1][0]._6_1_;
  *(char *)((long)in_RDI->val[1] + 7) =
       (b.val[1][0]._7_1_ < a.val[1][0]._7_1_) * b.val[1][0]._7_1_ |
       (b.val[1][0]._7_1_ >= a.val[1][0]._7_1_) * a.val[1][0]._7_1_;
  *(char *)(in_RDI->val[1] + 1) =
       ((char)b.val[1][1] < (char)a.val[1][1]) * (char)b.val[1][1] |
       ((char)b.val[1][1] >= (char)a.val[1][1]) * (char)a.val[1][1];
  *(char *)((long)in_RDI->val[1] + 9) =
       (b.val[1][1]._1_1_ < a.val[1][1]._1_1_) * b.val[1][1]._1_1_ |
       (b.val[1][1]._1_1_ >= a.val[1][1]._1_1_) * a.val[1][1]._1_1_;
  *(char *)((long)in_RDI->val[1] + 10) =
       (b.val[1][1]._2_1_ < a.val[1][1]._2_1_) * b.val[1][1]._2_1_ |
       (b.val[1][1]._2_1_ >= a.val[1][1]._2_1_) * a.val[1][1]._2_1_;
  *(char *)((long)in_RDI->val[1] + 0xb) =
       (b.val[1][1]._3_1_ < a.val[1][1]._3_1_) * b.val[1][1]._3_1_ |
       (b.val[1][1]._3_1_ >= a.val[1][1]._3_1_) * a.val[1][1]._3_1_;
  *(char *)((long)in_RDI->val[1] + 0xc) =
       (b.val[1][1]._4_1_ < a.val[1][1]._4_1_) * b.val[1][1]._4_1_ |
       (b.val[1][1]._4_1_ >= a.val[1][1]._4_1_) * a.val[1][1]._4_1_;
  *(char *)((long)in_RDI->val[1] + 0xd) =
       (b.val[1][1]._5_1_ < a.val[1][1]._5_1_) * b.val[1][1]._5_1_ |
       (b.val[1][1]._5_1_ >= a.val[1][1]._5_1_) * a.val[1][1]._5_1_;
  *(char *)((long)in_RDI->val[1] + 0xe) =
       (b.val[1][1]._6_1_ < a.val[1][1]._6_1_) * b.val[1][1]._6_1_ |
       (b.val[1][1]._6_1_ >= a.val[1][1]._6_1_) * a.val[1][1]._6_1_;
  *(char *)((long)in_RDI->val[1] + 0xf) =
       (b.val[1][1]._7_1_ < a.val[1][1]._7_1_) * b.val[1][1]._7_1_ |
       (b.val[1][1]._7_1_ >= a.val[1][1]._7_1_) * a.val[1][1]._7_1_;
  *(char *)in_RDI->val[0] =
       ((char)b.val[0][0] < (char)a.val[0][0]) * (char)b.val[0][0] |
       ((char)b.val[0][0] >= (char)a.val[0][0]) * (char)a.val[0][0];
  *(char *)((long)in_RDI->val[0] + 1) =
       (b.val[0][0]._1_1_ < a.val[0][0]._1_1_) * b.val[0][0]._1_1_ |
       (b.val[0][0]._1_1_ >= a.val[0][0]._1_1_) * a.val[0][0]._1_1_;
  *(char *)((long)in_RDI->val[0] + 2) =
       (b.val[0][0]._2_1_ < a.val[0][0]._2_1_) * b.val[0][0]._2_1_ |
       (b.val[0][0]._2_1_ >= a.val[0][0]._2_1_) * a.val[0][0]._2_1_;
  *(char *)((long)in_RDI->val[0] + 3) =
       (b.val[0][0]._3_1_ < a.val[0][0]._3_1_) * b.val[0][0]._3_1_ |
       (b.val[0][0]._3_1_ >= a.val[0][0]._3_1_) * a.val[0][0]._3_1_;
  *(char *)((long)in_RDI->val[0] + 4) =
       (b.val[0][0]._4_1_ < a.val[0][0]._4_1_) * b.val[0][0]._4_1_ |
       (b.val[0][0]._4_1_ >= a.val[0][0]._4_1_) * a.val[0][0]._4_1_;
  *(char *)((long)in_RDI->val[0] + 5) =
       (b.val[0][0]._5_1_ < a.val[0][0]._5_1_) * b.val[0][0]._5_1_ |
       (b.val[0][0]._5_1_ >= a.val[0][0]._5_1_) * a.val[0][0]._5_1_;
  *(char *)((long)in_RDI->val[0] + 6) =
       (b.val[0][0]._6_1_ < a.val[0][0]._6_1_) * b.val[0][0]._6_1_ |
       (b.val[0][0]._6_1_ >= a.val[0][0]._6_1_) * a.val[0][0]._6_1_;
  *(char *)((long)in_RDI->val[0] + 7) =
       (b.val[0][0]._7_1_ < a.val[0][0]._7_1_) * b.val[0][0]._7_1_ |
       (b.val[0][0]._7_1_ >= a.val[0][0]._7_1_) * a.val[0][0]._7_1_;
  *(char *)(in_RDI->val[0] + 1) =
       ((char)b.val[0][1] < (char)a.val[0][1]) * (char)b.val[0][1] |
       ((char)b.val[0][1] >= (char)a.val[0][1]) * (char)a.val[0][1];
  *(char *)((long)in_RDI->val[0] + 9) =
       (b.val[0][1]._1_1_ < a.val[0][1]._1_1_) * b.val[0][1]._1_1_ |
       (b.val[0][1]._1_1_ >= a.val[0][1]._1_1_) * a.val[0][1]._1_1_;
  *(char *)((long)in_RDI->val[0] + 10) =
       (b.val[0][1]._2_1_ < a.val[0][1]._2_1_) * b.val[0][1]._2_1_ |
       (b.val[0][1]._2_1_ >= a.val[0][1]._2_1_) * a.val[0][1]._2_1_;
  *(char *)((long)in_RDI->val[0] + 0xb) =
       (b.val[0][1]._3_1_ < a.val[0][1]._3_1_) * b.val[0][1]._3_1_ |
       (b.val[0][1]._3_1_ >= a.val[0][1]._3_1_) * a.val[0][1]._3_1_;
  *(char *)((long)in_RDI->val[0] + 0xc) =
       (b.val[0][1]._4_1_ < a.val[0][1]._4_1_) * b.val[0][1]._4_1_ |
       (b.val[0][1]._4_1_ >= a.val[0][1]._4_1_) * a.val[0][1]._4_1_;
  *(char *)((long)in_RDI->val[0] + 0xd) =
       (b.val[0][1]._5_1_ < a.val[0][1]._5_1_) * b.val[0][1]._5_1_ |
       (b.val[0][1]._5_1_ >= a.val[0][1]._5_1_) * a.val[0][1]._5_1_;
  *(char *)((long)in_RDI->val[0] + 0xe) =
       (b.val[0][1]._6_1_ < a.val[0][1]._6_1_) * b.val[0][1]._6_1_ |
       (b.val[0][1]._6_1_ >= a.val[0][1]._6_1_) * a.val[0][1]._6_1_;
  *(char *)((long)in_RDI->val[0] + 0xf) =
       (b.val[0][1]._7_1_ < a.val[0][1]._7_1_) * b.val[0][1]._7_1_ |
       (b.val[0][1]._7_1_ >= a.val[0][1]._7_1_) * a.val[0][1]._7_1_;
  return in_RDI;
}

Assistant:

SIMD_INLINE v256 v256_min_s8(v256 a, v256 b) {
  return v256_from_v128(v128_min_s8(a.val[1], b.val[1]),
                        v128_min_s8(a.val[0], b.val[0]));
}